

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

MockSpec<BasicTestExpr<2>_(BasicTestExpr<2>)> * __thiscall
testing::internal::FunctionMocker<BasicTestExpr<2>_(BasicTestExpr<2>)>::With
          (FunctionMocker<BasicTestExpr<2>_(BasicTestExpr<2>)> *this,Matcher<BasicTestExpr<2>_> *m1)

{
  MockSpec<BasicTestExpr<2>_(BasicTestExpr<2>)> *pMVar1;
  FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>)> *in_RDI;
  Matcher<BasicTestExpr<2>_> *in_stack_ffffffffffffffa8;
  
  FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>)>::current_spec(in_RDI);
  std::make_tuple<testing::Matcher<BasicTestExpr<2>>const&>(in_stack_ffffffffffffffa8);
  MockSpec<BasicTestExpr<2>_(BasicTestExpr<2>)>::SetMatchers
            ((MockSpec<BasicTestExpr<2>_(BasicTestExpr<2>)> *)in_RDI,
             (ArgumentMatcherTuple *)in_stack_ffffffffffffffa8);
  std::tuple<testing::Matcher<BasicTestExpr<2>_>_>::~tuple
            ((tuple<testing::Matcher<BasicTestExpr<2>_>_> *)0x1d1b71);
  pMVar1 = FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>)>::current_spec(in_RDI);
  return pMVar1;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1) {
    this->current_spec().SetMatchers(::std::tr1::make_tuple(m1));
    return this->current_spec();
  }